

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayoutTests.cpp
# Opt level: O1

void __thiscall
agge::tests::LayoutTests::SingleLineUnboundLayoutProducesSingleGlyphRuns(LayoutTests *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  long lVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  byte bVar8;
  factory_ptr f1;
  factory_ptr f2;
  positioned_glyph reference4 [1];
  positioned_glyph reference1 [1];
  positioned_glyph reference5 [9];
  positioned_glyph reference2 [3];
  positioned_glyph reference3 [3];
  layout l5;
  layout l4;
  layout l3;
  layout l2;
  layout l1;
  char_to_index indices2 [4];
  char_to_index indices1 [3];
  undefined1 local_498 [24];
  vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>> local_480 [24];
  bool local_468;
  LocationInfo local_460;
  vector<agge::text_line,_std::allocator<agge::text_line>_> local_438;
  vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_> local_420;
  vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_> local_408;
  string local_3f0;
  undefined1 local_3d0 [16];
  ref_text_line local_3c0;
  undefined1 local_398 [16];
  positioned_glyph local_388;
  undefined1 local_37c [12];
  undefined4 local_370;
  undefined1 local_36c [4];
  richtext_t local_368;
  undefined4 local_300;
  undefined1 local_2fc [12];
  undefined8 uStack_2f0;
  undefined8 local_2e8;
  undefined8 uStack_2e0;
  undefined4 local_2d8;
  positioned_glyph local_2d4;
  undefined1 local_2c8 [16];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined4 local_2a8;
  positioned_glyph local_2a4;
  layout local_298;
  layout local_248;
  layout local_1f8;
  layout local_1a8;
  layout local_158;
  undefined1 local_108 [40];
  double dStack_e0;
  double local_d8;
  pointer local_c8 [2];
  double dStack_b8;
  double local_b0;
  pointer ppStack_a8;
  pointer local_a0;
  pointer local_98;
  double dStack_90;
  double local_88;
  pointer ppStack_80;
  pointer local_78;
  pointer local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  bVar8 = 0;
  local_108._32_8_ = (pointer)0x100000041;
  dStack_e0 = 3.26083326255223e-322;
  local_d8 = 4.0019317313141e-322;
  local_108._16_8_ = (pointer)0x200000051;
  local_108._24_8_ = (pointer)0x300000020;
  local_108._0_8_ = 3.2114266979681e-322;
  local_108._8_8_ = 2.1219958235736e-314;
  local_c8[0] = (pointer)0x402a000000000000;
  local_c8[1] = (pointer)0x0;
  dStack_b8 = 0.0;
  local_b0 = 0.0;
  ppStack_a8 = (pointer)0x0;
  local_a0 = (pointer)0x4026000000000000;
  local_98 = (pointer)0x0;
  dStack_90 = 0.0;
  local_88 = 0.0;
  ppStack_80 = (pointer)0x0;
  local_78 = (pointer)0x4029666666666666;
  local_70 = (pointer)0x0;
  uStack_68 = 0;
  local_60 = 0;
  uStack_58 = 0;
  local_50 = 0x4024333333333333;
  local_48 = 0;
  uStack_40 = 0;
  local_38 = 0;
  uStack_30 = 0;
  create_single_font_factory<3ul,4ul>
            ((LayoutTests *)local_3d0,(font_metrics *)this,
             (char_to_index (*) [3])(anonymous_namespace)::c_fm1,(glyph (*) [4])(local_108 + 0x20));
  create_single_font_factory<4ul,4ul>
            ((LayoutTests *)local_398,(font_metrics *)this,
             (char_to_index (*) [4])(anonymous_namespace)::c_fm2,(glyph (*) [4])local_108);
  local_158._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_158._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_158._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_158._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_158._glyphs._limit = (positioned_glyph *)0x0;
  local_158._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_158._glyphs._begin = (positioned_glyph *)0x0;
  local_158._glyphs._end = (positioned_glyph *)0x0;
  local_158._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_1a8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1a8._glyphs._limit = (positioned_glyph *)0x0;
  local_1a8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8._glyphs._begin = (positioned_glyph *)0x0;
  local_1a8._glyphs._end = (positioned_glyph *)0x0;
  local_1f8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_1f8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_1f8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1f8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1f8._glyphs._limit = (positioned_glyph *)0x0;
  local_1f8._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1f8._glyphs._begin = (positioned_glyph *)0x0;
  local_1f8._glyphs._end = (positioned_glyph *)0x0;
  local_248._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_248._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_248._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_248._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_248._glyphs._limit = (positioned_glyph *)0x0;
  local_248._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_248._glyphs._begin = (positioned_glyph *)0x0;
  local_248._glyphs._end = (positioned_glyph *)0x0;
  local_298._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_start = (text_line *)0x0;
  local_298._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
  _M_impl.super__Vector_impl_data._M_finish = (text_line *)0x0;
  local_298._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_298._glyphs._limit = (positioned_glyph *)0x0;
  local_298._glyph_runs.super__Vector_base<agge::glyph_run,_std::allocator<agge::glyph_run>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_298._glyphs._begin = (positioned_glyph *)0x0;
  local_298._glyphs._end = (positioned_glyph *)0x0;
  pcVar1 = local_498 + 0x10;
  local_498._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"A","");
  R((richtext_t *)(local_36c + 4),(string *)local_498);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_158,local_36c + 4,local_3d0._0_8_);
  paVar2 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)((long)&local_368._base_annotation.basic.family + 0x10);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._base_annotation.basic.family._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_368._annotations);
  paVar3 = &local_368._underlying.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._underlying._M_dataplus._M_p != paVar3) {
    operator_delete(local_368._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_498._0_8_ != pcVar1) {
    operator_delete((void *)local_498._0_8_);
  }
  local_498._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"AAB","");
  R((richtext_t *)(local_36c + 4),(string *)local_498);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_1a8,local_36c + 4,local_3d0._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._base_annotation.basic.family._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_368._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._underlying._M_dataplus._M_p != paVar3) {
    operator_delete(local_368._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_498._0_8_ != pcVar1) {
    operator_delete((void *)local_498._0_8_);
  }
  local_498._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"BQA","");
  R((richtext_t *)(local_36c + 4),(string *)local_498);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_1f8,local_36c + 4,local_3d0._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._base_annotation.basic.family._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_368._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._underlying._M_dataplus._M_p != paVar3) {
    operator_delete(local_368._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_498._0_8_ != pcVar1) {
    operator_delete((void *)local_498._0_8_);
  }
  local_498._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"A","");
  R((richtext_t *)(local_36c + 4),(string *)local_498);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_248,local_36c + 4,local_398._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._base_annotation.basic.family._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_368._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._underlying._M_dataplus._M_p != paVar3) {
    operator_delete(local_368._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_498._0_8_ != pcVar1) {
    operator_delete((void *)local_498._0_8_);
  }
  local_498._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_498,"ABQ A  QA","");
  R((richtext_t *)(local_36c + 4),(string *)local_498);
  layout::process<agge::limit::base,agge::tests::LayoutTests::font_factory>
            (&local_298,local_36c + 4,local_398._0_8_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._base_annotation.basic.family._M_dataplus._M_p != paVar2) {
    operator_delete(local_368._base_annotation.basic.family._M_dataplus._M_p);
  }
  std::
  vector<std::pair<agge::font_style_annotation,_unsigned_long>,_std::allocator<std::pair<agge::font_style_annotation,_unsigned_long>_>_>
  ::~vector(&local_368._annotations);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._underlying._M_dataplus._M_p != paVar3) {
    operator_delete(local_368._underlying._M_dataplus._M_p);
  }
  if ((pointer)local_498._0_8_ != pcVar1) {
    operator_delete((void *)local_498._0_8_);
  }
  local_370 = 0;
  local_37c._4_4_ = 1.4013e-45;
  local_37c._8_4_ = 11.0;
  local_2d8 = 0;
  local_2fc._4_4_ = 1.4013e-45;
  local_2fc._8_4_ = 11.0;
  uStack_2f0 = 0x100000000;
  local_2e8 = 0x41300000;
  uStack_2e0 = 0x4150000000000000;
  local_2c8._8_8_ = 0;
  local_2a8 = 0;
  local_2c8._0_4_ = 0;
  local_2c8._4_4_ = 13.0;
  local_2b8 = 0x41500000;
  uStack_2b0 = 0x4130000000000001;
  local_388.d.dy = 0.0;
  local_388.index = 0;
  local_388.d.dx = 13.0;
  puVar6 = &DAT_001a2640;
  puVar7 = (undefined8 *)(local_36c + 4);
  for (lVar5 = 0xd; lVar5 != 0; lVar5 = lVar5 + -1) {
    *puVar7 = *puVar6;
    puVar6 = puVar6 + (ulong)bVar8 * -2 + 1;
    puVar7 = puVar7 + (ulong)bVar8 * -2 + 1;
  }
  local_300 = 0;
  local_498._0_8_ = *(undefined8 *)(local_3d0._0_8_ + 8);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_3d0._0_8_ + 0x10);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_498._16_8_ = 0;
  local_498._8_8_ = p_Var4;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  vector<agge::positioned_glyph*,void>
            (local_480,(positioned_glyph *)(local_37c + 4),(positioned_glyph *)local_36c,
             (allocator_type *)&local_460);
  local_468 = true;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_420,1,(value_type *)local_498,(allocator_type *)&local_460);
  ref_text_line::ref_text_line(&local_3c0,0.0,10.0,0.0,&local_420);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_408,1,&local_3c0,(allocator_type *)&local_460);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_438,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_158._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_158._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_460);
  paVar3 = &local_3f0.field_2;
  local_3f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_460,&local_3f0,0xa5);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_408,&local_438,&local_460);
  paVar2 = &local_460.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_460.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if (local_438.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_408);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3c0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_420);
  if ((void *)local_480._0_8_ != (void *)0x0) {
    operator_delete((void *)local_480._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_498._0_8_ = *(undefined8 *)(local_3d0._0_8_ + 8);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_3d0._0_8_ + 0x10);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_498._16_8_ = 0;
  local_498._8_8_ = p_Var4;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  vector<agge::positioned_glyph*,void>
            (local_480,(positioned_glyph *)(local_2fc + 4),&local_2d4,(allocator_type *)&local_460);
  local_468 = true;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_420,1,(value_type *)local_498,(allocator_type *)&local_460);
  ref_text_line::ref_text_line(&local_3c0,0.0,10.0,0.0,&local_420);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_408,1,&local_3c0,(allocator_type *)&local_460);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_438,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1a8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1a8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_460);
  local_3f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_460,&local_3f0,0xa8);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_408,&local_438,&local_460);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_460.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if (local_438.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_408);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3c0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_420);
  if ((void *)local_480._0_8_ != (void *)0x0) {
    operator_delete((void *)local_480._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_498._0_8_ = *(undefined8 *)(local_3d0._0_8_ + 8);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_3d0._0_8_ + 0x10);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_498._16_8_ = 0;
  local_498._8_8_ = p_Var4;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  vector<agge::positioned_glyph*,void>
            (local_480,(positioned_glyph *)local_2c8,&local_2a4,(allocator_type *)&local_460);
  local_468 = true;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_420,1,(value_type *)local_498,(allocator_type *)&local_460);
  ref_text_line::ref_text_line(&local_3c0,0.0,10.0,0.0,&local_420);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_408,1,&local_3c0,(allocator_type *)&local_460);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_438,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1f8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_1f8._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_460);
  local_3f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_460,&local_3f0,0xab);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_408,&local_438,&local_460);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_460.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if (local_438.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_408);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3c0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_420);
  if ((void *)local_480._0_8_ != (void *)0x0) {
    operator_delete((void *)local_480._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_498._0_8_ = *(undefined8 *)(local_398._0_8_ + 8);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_398._0_8_ + 0x10);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_498._16_8_ = 0;
  local_498._8_8_ = p_Var4;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  vector<agge::positioned_glyph*,void>
            (local_480,&local_388,(positioned_glyph *)local_37c,(allocator_type *)&local_460);
  local_468 = true;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_420,1,(value_type *)local_498,(allocator_type *)&local_460);
  ref_text_line::ref_text_line(&local_3c0,0.0,14.0,0.0,&local_420);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_408,1,&local_3c0,(allocator_type *)&local_460);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_438,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_248._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_248._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_460);
  local_3f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_460,&local_3f0,0xae);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_408,&local_438,&local_460);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_460.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if (local_438.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_408);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3c0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_420);
  if ((void *)local_480._0_8_ != (void *)0x0) {
    operator_delete((void *)local_480._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  local_498._0_8_ = *(undefined8 *)(local_398._0_8_ + 8);
  p_Var4 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_398._0_8_ + 0x10);
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
    }
  }
  local_498._16_8_ = 0;
  local_498._8_8_ = p_Var4;
  std::vector<agge::positioned_glyph,std::allocator<agge::positioned_glyph>>::
  vector<agge::positioned_glyph*,void>
            (local_480,(positioned_glyph *)(local_36c + 4),(positioned_glyph *)local_2fc,
             (allocator_type *)&local_460);
  local_468 = true;
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::vector
            (&local_420,1,(value_type *)local_498,(allocator_type *)&local_460);
  ref_text_line::ref_text_line(&local_3c0,0.0,14.0,0.0,&local_420);
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::vector
            (&local_408,1,&local_3c0,(allocator_type *)&local_460);
  std::vector<agge::text_line,std::allocator<agge::text_line>>::
  vector<__gnu_cxx::__normal_iterator<agge::text_line_const*,std::vector<agge::text_line,std::allocator<agge::text_line>>>,void>
            ((vector<agge::text_line,std::allocator<agge::text_line>> *)&local_438,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_298._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_start,
             (__normal_iterator<const_agge::text_line_*,_std::vector<agge::text_line,_std::allocator<agge::text_line>_>_>
              )local_298._text_lines.
               super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
               super__Vector_impl_data._M_finish,(allocator_type *)&local_460);
  local_3f0._M_dataplus._M_p = (pointer)paVar3;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_3f0,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge.text/LayoutTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_460,&local_3f0,0xb1);
  ut::
  are_equal<std::vector<agge::tests::ref_text_line,std::allocator<agge::tests::ref_text_line>>,std::vector<agge::text_line,std::allocator<agge::text_line>>>
            (&local_408,&local_438,&local_460);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_460.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_460.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f0._M_dataplus._M_p != paVar3) {
    operator_delete(local_3f0._M_dataplus._M_p);
  }
  if (local_438.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_438.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  std::vector<agge::tests::ref_text_line,_std::allocator<agge::tests::ref_text_line>_>::~vector
            (&local_408);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_3c0._glyph_runs);
  std::vector<agge::tests::ref_glyph_run,_std::allocator<agge::tests::ref_glyph_run>_>::~vector
            (&local_420);
  if ((void *)local_480._0_8_ != (void *)0x0) {
    operator_delete((void *)local_480._0_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_498._8_8_);
  }
  if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
  }
  if (local_298._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_298._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_298._glyph_runs);
  if (local_298._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_298._glyphs._begin);
  }
  if (local_248._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_248._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_248._glyph_runs);
  if (local_248._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_248._glyphs._begin);
  }
  if (local_1f8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_1f8._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_1f8._glyph_runs);
  if (local_1f8._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_1f8._glyphs._begin);
  }
  if (local_1a8._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_1a8._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_1a8._glyph_runs);
  if (local_1a8._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_1a8._glyphs._begin);
  }
  if (local_158._text_lines.super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>.
      _M_impl.super__Vector_impl_data._M_start != (text_line *)0x0) {
    operator_delete(local_158._text_lines.
                    super__Vector_base<agge::text_line,_std::allocator<agge::text_line>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::vector<agge::glyph_run,_std::allocator<agge::glyph_run>_>::~vector(&local_158._glyph_runs);
  if (local_158._glyphs._begin != (positioned_glyph *)0x0) {
    operator_delete__(local_158._glyphs._begin);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_398._8_8_);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d0._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_3d0._8_8_);
  }
  lVar5 = 0x88;
  do {
    if (*(void **)((long)local_c8 + lVar5) != (void *)0x0) {
      operator_delete(*(void **)((long)local_c8 + lVar5));
    }
    lVar5 = lVar5 + -0x28;
  } while (lVar5 != -0x18);
  return;
}

Assistant:

test( SingleLineUnboundLayoutProducesSingleGlyphRuns )
			{
				// INIT
				mocks::font_accessor::char_to_index indices1[] = { { L'A', 1 }, { L'B', 0 }, { L'Q', 0 }, };
				mocks::font_accessor::char_to_index indices2[] = { { L'A', 0 }, { L'B', 1 }, { L'Q', 2 }, { L' ', 3 } };
				mocks::font_accessor::glyph glyphs[] = {
					{ { 13, 0 } },
					{ { 11, 0 } },
					{ { 12.7, 0 } },
					{ { 10.1, 0 } },
				};
				factory_ptr f1 = create_single_font_factory(c_fm1, indices1, glyphs);
				factory_ptr f2 = create_single_font_factory(c_fm2, indices2, glyphs);
				layout::const_iterator gr;

				// INIT / ACT
				layout l1;
				layout l2;
				layout l3;
				layout l4;
				layout l5;

				l1.process(R("A"), limit::none(), *f1);
				l2.process(R("AAB"), limit::none(), *f1);
				l3.process(R("BQA"), limit::none(), *f1);
				l4.process(R("A"), limit::none(), *f2);
				l5.process(R("ABQ A  QA"), limit::none(), *f2);

				// ASSERT
				positioned_glyph reference1[] = { { 1, { 11.0f, 0.0f } } };
				positioned_glyph reference2[] = { { 1, { 11.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, { 0, { 13.0f, 0.0f } }, };
				positioned_glyph reference3[] = { { 0, { 13.0f, 0.0f } }, { 0, { 13.0f, 0.0f } }, { 1, { 11.0f, 0.0f } }, };
				positioned_glyph reference4[] = { { 0, { 13.0f, 0.0f } }, };
				positioned_glyph reference5[] = {
					{ 0, { 13.0f, 0.0f } },
					{ 1, { 11.0f, 0.0f } },
					{ 2, { 12.7f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 0, { 13.0f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 3, { 10.1f, 0.0f } },
					{ 2, { 12.7f, 0.0f } },
					{ 0, { 13.0f, 0.0f } },
				};

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference1)),
					mkvector(l1.begin(), l1.end()));

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference2)),
					mkvector(l2.begin(), l2.end()));

				assert_equal(plural + ref_text_line(0.0f, 10.0f, 0.0f, plural + ref_glyph_run(**f1, 0.0f, 0.0f, reference3)),
					mkvector(l3.begin(), l3.end()));

				assert_equal(plural + ref_text_line(0.0f, 14.0f, 0.0f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference4)),
					mkvector(l4.begin(), l4.end()));

				assert_equal(plural + ref_text_line(0.0f, 14.0f, 0.0f, plural + ref_glyph_run(**f2, 0.0f, 0.0f, reference5)),
					mkvector(l5.begin(), l5.end()));
			}